

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O2

ImageSpec * __thiscall
ImageInput::spec_dimensions
          (ImageSpec *__return_storage_ptr__,ImageInput *this,uint32_t param_1,uint32_t param_2)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->_vptr_ImageInput[0xe])(this);
  ImageSpec::ImageSpec(__return_storage_ptr__,(ImageSpec *)CONCAT44(extraout_var,iVar1));
  return __return_storage_ptr__;
}

Assistant:

virtual ImageSpec spec_dimensions (uint32_t /*subimage*/, uint32_t /*miplevel=0*/) {
        return spec();
    }